

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_elements_confidentialtransaction.cpp
# Opt level: O3

void __thiscall
ConfidentialTransaction_TxOutTest_Test::TestBody(ConfidentialTransaction_TxOutTest_Test *this)

{
  AssertHelper AVar1;
  undefined8 uVar2;
  pointer pCVar3;
  bool bVar4;
  undefined4 uVar5;
  AssertHelperData *pAVar6;
  undefined1 extraout_DL;
  undefined1 extraout_DL_00;
  char *pcVar7;
  ulong uVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar9;
  _func_int **pp_Var10;
  size_t sVar11;
  AssertionResult gtest_ar_7;
  AssertionResult gtest_ar_13;
  uint32_t index;
  uint32_t get_index;
  AssertionResult gtest_ar_23;
  AssertionResult gtest_ar_1;
  Script exp_locking_script2;
  ConfidentialNonce nonce;
  vector<cfd::core::ConfidentialTxOutReference,_std::allocator<cfd::core::ConfidentialTxOutReference>_>
  txout_list;
  ConfidentialTxOutReference txout_ref;
  ConfidentialTransaction tx;
  ByteData surjection_proof;
  ByteData range_proof;
  ConfidentialAssetId asset;
  AssertHelper local_398;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  sStack_390;
  undefined1 local_388 [16];
  AssertHelper local_378;
  _Alloc_hider _Stack_370;
  undefined1 local_368 [24];
  AssertHelper local_350;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_348;
  undefined1 local_340 [16];
  undefined1 local_330 [64];
  ConfidentialAssetId local_2f0;
  ConfidentialValue local_2c8;
  ConfidentialNonce local_2a0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_278;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_260;
  undefined1 local_248 [56];
  undefined1 local_210 [40];
  vector<cfd::core::ConfidentialTxOutReference,_std::allocator<cfd::core::ConfidentialTxOutReference>_>
  local_1e8;
  undefined1 local_1d0 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1c8;
  undefined1 local_1c0;
  Script local_1b8;
  ConfidentialAssetId local_180;
  ConfidentialValue local_158;
  ConfidentialNonce local_130;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_108;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_f0;
  Script local_d8;
  ConfidentialAssetId local_98;
  ByteData local_70;
  ConfidentialAssetId local_58;
  
  cfd::core::ConfidentialTransaction::ConfidentialTransaction
            ((ConfidentialTransaction *)&local_d8,(string *)&exp_tx_empty_hex_abi_cxx11_);
  local_368._16_4_ = 0;
  local_368._20_4_ = 0;
  bVar4 = testing::internal::AlwaysTrue();
  if (bVar4) {
    bVar4 = testing::internal::AlwaysTrue();
    if (bVar4) {
      local_368._16_4_ =
           cfd::core::ConfidentialTransaction::AddTxIn
                     ((Txid *)&local_d8,0x4e9ee8,2,(Script *)0xfffffffe);
    }
  }
  else {
    testing::Message::Message((Message *)local_1d0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_340,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x26a,
               "Expected: (index = tx.AddTxIn(exp_txid, exp_index, exp_sequence)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)local_340,(Message *)local_1d0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_340);
    if (CONCAT71(local_1d0._1_7_,local_1d0[0]) != 0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && ((long *)CONCAT71(local_1d0._1_7_,local_1d0[0]) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT71(local_1d0._1_7_,local_1d0[0]) + 8))();
      }
    }
  }
  local_340._0_4_ = cfd::core::ConfidentialTransaction::GetTxOutCount();
  local_248._0_8_ = (ulong)(uint)local_248._4_4_ << 0x20;
  testing::internal::CmpHelperEQ<unsigned_int,int>
            ((internal *)local_1d0,"tx.GetTxOutCount()","0",(uint *)local_340,(int *)local_248);
  if (local_1d0[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_340);
    if (local_1c8.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar7 = "";
    }
    else {
      pcVar7 = ((local_1c8.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_248,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x26d,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_248,(Message *)local_340);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_248);
    if ((AssertHelperData *)local_340._0_8_ != (AssertHelperData *)0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && ((AssertHelperData *)local_340._0_8_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_340._0_8_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_1c8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  bVar4 = testing::internal::AlwaysTrue();
  if (bVar4) {
    local_368._20_4_ = cfd::core::ConfidentialTransaction::GetTxOutIndex(&local_d8);
  }
  testing::Message::Message((Message *)local_1d0);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)local_340,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
             ,0x26f,
             "Expected: (get_index = tx.GetTxOutIndex(exp_locking_script)) throws an exception of type CfdException.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=((AssertHelper *)local_340,(Message *)local_1d0);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_340);
  if (CONCAT71(local_1d0._1_7_,local_1d0[0]) != 0) {
    bVar4 = testing::internal::IsTrue(true);
    if ((bVar4) && ((long *)CONCAT71(local_1d0._1_7_,local_1d0[0]) != (long *)0x0)) {
      (**(code **)(*(long *)CONCAT71(local_1d0._1_7_,local_1d0[0]) + 8))();
    }
  }
  local_98._vptr_ConfidentialAssetId =
       (_func_int **)cfd::core::Amount::CreateBySatoshiAmount(0xbc614e);
  local_98.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start._0_1_ = extraout_DL;
  cfd::core::ConfidentialAssetId::ConfidentialAssetId(&local_58,(string *)&exp_assetid_abi_cxx11_);
  cfd::core::ConfidentialTxOutReference::ConfidentialTxOutReference
            ((ConfidentialTxOutReference *)local_1d0);
  bVar4 = testing::internal::AlwaysTrue();
  if (bVar4) {
    bVar4 = testing::internal::AlwaysTrue();
    if (bVar4) {
      local_368._16_4_ =
           cfd::core::ConfidentialTransaction::AddTxOut
                     ((Amount *)&local_d8,&local_98,(Script *)&local_58);
    }
  }
  else {
    testing::Message::Message((Message *)local_340);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_248,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x274,
               "Expected: (index = tx.AddTxOut(amt, asset, exp_locking_script)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)local_248,(Message *)local_340);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_248);
    if ((AssertHelperData *)local_340._0_8_ != (AssertHelperData *)0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && ((AssertHelperData *)local_340._0_8_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_340._0_8_ + 8))();
      }
    }
  }
  local_248._0_8_ = local_248._0_8_ & 0xffffffff00000000;
  testing::internal::CmpHelperEQ<unsigned_int,int>
            ((internal *)local_340,"index","0",(uint *)(local_368 + 0x10),(int *)local_248);
  if ((internal)local_340[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_248);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_340._8_8_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *(char **)local_340._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_210,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x275,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_210,(Message *)local_248);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_210);
    if ((AssertHelperData *)local_248._0_8_ != (AssertHelperData *)0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && ((AssertHelperData *)local_248._0_8_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_248._0_8_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_340 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  uVar5 = cfd::core::ConfidentialTransaction::GetTxOutCount();
  local_248._0_4_ = uVar5;
  local_210._0_4_ = 1;
  testing::internal::CmpHelperEQ<unsigned_int,int>
            ((internal *)local_340,"tx.GetTxOutCount()","1",(uint *)local_248,(int *)local_210);
  if ((internal)local_340[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_248);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_340._8_8_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *(char **)local_340._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_210,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x276,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_210,(Message *)local_248);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_210);
    if ((AssertHelperData *)local_248._0_8_ != (AssertHelperData *)0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && ((AssertHelperData *)local_248._0_8_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_248._0_8_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_340 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  bVar4 = testing::internal::AlwaysTrue();
  if (bVar4) {
    bVar4 = testing::internal::AlwaysTrue();
    if (bVar4) {
      local_368._20_4_ = cfd::core::ConfidentialTransaction::GetTxOutIndex(&local_d8);
    }
  }
  else {
    testing::Message::Message((Message *)local_340);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_248,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x277,
               "Expected: get_index = tx.GetTxOutIndex(exp_locking_script) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)local_248,(Message *)local_340);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_248);
    if ((AssertHelperData *)local_340._0_8_ != (AssertHelperData *)0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && ((AssertHelperData *)local_340._0_8_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_340._0_8_ + 8))();
      }
    }
  }
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            ((internal *)local_340,"index","get_index",(uint *)(local_368 + 0x10),
             (uint *)(local_368 + 0x14));
  if ((internal)local_340[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_248);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_340._8_8_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *(char **)local_340._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_210,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x278,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_210,(Message *)local_248);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_210);
    if ((AssertHelperData *)local_248._0_8_ != (AssertHelperData *)0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && ((AssertHelperData *)local_248._0_8_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_248._0_8_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_340 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  bVar4 = testing::internal::AlwaysTrue();
  if (bVar4) {
    cfd::core::ConfidentialTransaction::GetTxOut((uint)local_340);
    local_1c0 = local_330[0];
    local_1c8.ptr_ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_340._8_8_;
    cfd::core::Script::operator=(&local_1b8,(Script *)(local_330 + 8));
    cfd::core::ConfidentialAssetId::operator=(&local_180,&local_2f0);
    cfd::core::ConfidentialValue::operator=(&local_158,&local_2c8);
    cfd::core::ConfidentialNonce::operator=(&local_130,&local_2a0);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=(&local_108,&local_278);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=(&local_f0,&local_260);
    cfd::core::ConfidentialTxOutReference::~ConfidentialTxOutReference
              ((ConfidentialTxOutReference *)local_340);
  }
  testing::Message::Message((Message *)local_340);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)local_248,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
             ,0x27a,
             "Expected: (txout_ref = tx.GetTxOut(index + 5)) throws an exception of type CfdException.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=((AssertHelper *)local_248,(Message *)local_340);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_248);
  if ((AssertHelperData *)local_340._0_8_ != (AssertHelperData *)0x0) {
    bVar4 = testing::internal::IsTrue(true);
    if ((bVar4) && ((AssertHelperData *)local_340._0_8_ != (AssertHelperData *)0x0)) {
      (**(code **)(*(long *)local_340._0_8_ + 8))();
    }
  }
  bVar4 = testing::internal::AlwaysTrue();
  if (bVar4) {
    bVar4 = testing::internal::AlwaysTrue();
    if (bVar4) {
      cfd::core::ConfidentialTransaction::GetTxOut((uint)local_340);
      local_1c0 = local_330[0];
      local_1c8.ptr_ =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_340._8_8_;
      cfd::core::Script::operator=(&local_1b8,(Script *)(local_330 + 8));
      cfd::core::ConfidentialAssetId::operator=(&local_180,&local_2f0);
      cfd::core::ConfidentialValue::operator=(&local_158,&local_2c8);
      cfd::core::ConfidentialNonce::operator=(&local_130,&local_2a0);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=(&local_108,&local_278);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=(&local_f0,&local_260);
      cfd::core::ConfidentialTxOutReference::~ConfidentialTxOutReference
                ((ConfidentialTxOutReference *)local_340);
    }
  }
  else {
    testing::Message::Message((Message *)local_340);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_248,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x27b,
               "Expected: (txout_ref = tx.GetTxOut(index)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)local_248,(Message *)local_340);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_248);
    if ((AssertHelperData *)local_340._0_8_ != (AssertHelperData *)0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && ((AssertHelperData *)local_340._0_8_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_340._0_8_ + 8))();
      }
    }
  }
  cfd::core::ConfidentialAssetId::ConfidentialAssetId((ConfidentialAssetId *)local_340,&local_180);
  cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_210,"txout_ref.GetAsset().GetHex().c_str()",
             "\"6f1a4b6bd5571b5f08ab79c314dc6483f9b952af2f5ef206cd6f8e68eb1186f3\"",
             (char *)local_248._0_8_,
             "6f1a4b6bd5571b5f08ab79c314dc6483f9b952af2f5ef206cd6f8e68eb1186f3");
  pAVar6 = (AssertHelperData *)(local_248 + 0x10);
  if ((AssertHelperData *)local_248._0_8_ != pAVar6) {
    operator_delete((void *)local_248._0_8_);
  }
  local_340._0_8_ = &PTR__ConfidentialAssetId_004e1078;
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_340._8_8_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    operator_delete((void *)local_340._8_8_);
  }
  if (local_210[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_340);
    if ((pointer)local_210._8_8_ == (pointer)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *(char **)local_210._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_248,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x27e,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_248,(Message *)local_340);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_248);
    if ((AssertHelperData *)local_340._0_8_ != (AssertHelperData *)0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && ((AssertHelperData *)local_340._0_8_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(undefined **)local_340._0_8_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_210 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  cfd::core::ConfidentialValue::ConfidentialValue((ConfidentialValue *)local_340,&local_158);
  cfd::core::ConfidentialValue::GetHex_abi_cxx11_();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_210,"txout_ref.GetConfidentialValue().GetHex().c_str()",
             "\"010000000000bc614e\"",(char *)local_248._0_8_,"010000000000bc614e");
  if ((AssertHelperData *)local_248._0_8_ != pAVar6) {
    operator_delete((void *)local_248._0_8_);
  }
  local_340._0_8_ = &PTR__ConfidentialValue_004e0f10;
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_340._8_8_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    operator_delete((void *)local_340._8_8_);
  }
  if (local_210[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_340);
    if ((pointer)local_210._8_8_ == (pointer)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *(char **)local_210._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_248,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x280,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_248,(Message *)local_340);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_248);
    if ((AssertHelperData *)local_340._0_8_ != (AssertHelperData *)0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && ((AssertHelperData *)local_340._0_8_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(undefined **)local_340._0_8_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_210 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  cfd::core::Script::Script((Script *)local_340,&local_1b8);
  cfd::core::Script::GetHex_abi_cxx11_();
  uVar2 = local_248._0_8_;
  cfd::core::Script::GetHex_abi_cxx11_();
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_398,"txout_ref.GetLockingScript().GetHex().c_str()",
             "exp_locking_script.GetHex().c_str()",(char *)uVar2,(char *)local_210._0_8_);
  if ((AssertHelperData *)local_210._0_8_ != (AssertHelperData *)(local_210 + 0x10)) {
    operator_delete((void *)local_210._0_8_);
  }
  if ((AssertHelperData *)local_248._0_8_ != pAVar6) {
    operator_delete((void *)local_248._0_8_);
  }
  cfd::core::Script::~Script((Script *)local_340);
  if (local_398.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_340);
    if (sStack_390.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar7 = "";
    }
    else {
      pcVar7 = ((sStack_390.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_248,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x282,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_248,(Message *)local_340);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_248);
    if ((AssertHelperData *)local_340._0_8_ != (AssertHelperData *)0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && ((AssertHelperData *)local_340._0_8_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(undefined **)local_340._0_8_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&sStack_390,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::ConfidentialNonce::ConfidentialNonce((ConfidentialNonce *)local_340,&local_130);
  cfd::core::ConfidentialNonce::GetHex_abi_cxx11_();
  pcVar7 = "";
  testing::internal::CmpHelperSTREQ
            ((internal *)local_210,"txout_ref.GetNonce().GetHex().c_str()","\"\"",
             (char *)local_248._0_8_,"");
  if ((AssertHelperData *)local_248._0_8_ != pAVar6) {
    operator_delete((void *)local_248._0_8_);
  }
  local_340._0_8_ = &PTR__ConfidentialNonce_004e1260;
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_340._8_8_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    operator_delete((void *)local_340._8_8_);
  }
  if (local_210[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_340);
    if ((pointer)local_210._8_8_ != (pointer)0x0) {
      pcVar7 = *(char **)local_210._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_248,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x283,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_248,(Message *)local_340);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_248);
    if ((AssertHelperData *)local_340._0_8_ != (AssertHelperData *)0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && ((AssertHelperData *)local_340._0_8_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(undefined **)local_340._0_8_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_210 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  local_248._0_8_ = (AssertHelperData *)0x0;
  local_248._8_8_ = (pointer)0x0;
  local_248._16_8_ = (pointer)0x0;
  uVar8 = (long)local_108.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_108.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
  if (uVar8 == 0) {
    pAVar6 = (AssertHelperData *)0x0;
    sVar11 = 0;
  }
  else {
    if ((long)uVar8 < 0) {
      std::__throw_bad_alloc();
    }
    pAVar6 = (AssertHelperData *)operator_new(uVar8);
    sVar11 = (long)local_108.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)local_108.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start;
  }
  local_248._16_8_ = uVar8 + (long)pAVar6;
  local_248._0_8_ = pAVar6;
  if (local_108.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      local_108.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start) {
    local_248._8_8_ = pAVar6;
    memmove(pAVar6,local_108.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start,sVar11);
  }
  local_248._8_8_ = (long)&pAVar6->type + sVar11;
  cfd::core::ByteData::GetHex_abi_cxx11_();
  pcVar7 = "";
  testing::internal::CmpHelperSTREQ
            ((internal *)local_210,"txout_ref.GetSurjectionProof().GetHex().c_str()","\"\"",
             (char *)local_340._0_8_,"");
  if ((AssertHelperData *)local_340._0_8_ != (AssertHelperData *)local_330) {
    operator_delete((void *)local_340._0_8_);
  }
  if ((AssertHelperData *)local_248._0_8_ != (AssertHelperData *)0x0) {
    operator_delete((void *)local_248._0_8_);
  }
  if (local_210[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_340);
    if ((pointer)local_210._8_8_ != (pointer)0x0) {
      pcVar7 = *(char **)local_210._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_248,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x284,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_248,(Message *)local_340);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_248);
    if ((AssertHelperData *)local_340._0_8_ != (AssertHelperData *)0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && ((AssertHelperData *)local_340._0_8_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(undefined **)local_340._0_8_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_210 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  local_248._0_8_ = (AssertHelperData *)0x0;
  local_248._8_8_ = (pointer)0x0;
  local_248._16_8_ = (pointer)0x0;
  uVar8 = (long)local_f0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_f0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
  if (uVar8 == 0) {
    pAVar6 = (AssertHelperData *)0x0;
    sVar11 = 0;
  }
  else {
    if ((long)uVar8 < 0) {
      std::__throw_bad_alloc();
    }
    pAVar6 = (AssertHelperData *)operator_new(uVar8);
    sVar11 = (long)local_f0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)local_f0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start;
  }
  local_248._16_8_ = uVar8 + (long)pAVar6;
  local_248._0_8_ = pAVar6;
  if (local_f0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      local_f0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start) {
    local_248._8_8_ = pAVar6;
    memmove(pAVar6,local_f0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start,sVar11);
  }
  local_248._8_8_ = (long)&pAVar6->type + sVar11;
  cfd::core::ByteData::GetHex_abi_cxx11_();
  pcVar7 = "";
  testing::internal::CmpHelperSTREQ
            ((internal *)local_210,"txout_ref.GetRangeProof().GetHex().c_str()","\"\"",
             (char *)local_340._0_8_,"");
  if ((AssertHelperData *)local_340._0_8_ != (AssertHelperData *)local_330) {
    operator_delete((void *)local_340._0_8_);
  }
  if ((AssertHelperData *)local_248._0_8_ != (AssertHelperData *)0x0) {
    operator_delete((void *)local_248._0_8_);
  }
  if (local_210[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_340);
    if ((pointer)local_210._8_8_ != (pointer)0x0) {
      pcVar7 = *(char **)local_210._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_248,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x285,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_248,(Message *)local_340);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_248);
    if ((AssertHelperData *)local_340._0_8_ != (AssertHelperData *)0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && ((AssertHelperData *)local_340._0_8_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(undefined **)local_340._0_8_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_210 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  local_340._0_8_ = (AssertHelperData *)local_330;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_340,"00146a98a3f2935718df72518c00768ec67c589e0b28","");
  cfd::core::Script::Script((Script *)local_248,(string *)local_340);
  if ((AssertHelperData *)local_340._0_8_ != (AssertHelperData *)local_330) {
    operator_delete((void *)local_340._0_8_);
  }
  local_340._0_8_ = (AssertHelperData *)local_330;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_340,"991a4b6bd5571b5f08ab79c314dc6483f9b952af2f5ef206cd6f8e68eb1186f3",
             "");
  cfd::core::ConfidentialNonce::ConfidentialNonce
            ((ConfidentialNonce *)local_210,(string *)local_340);
  if ((AssertHelperData *)local_340._0_8_ != (AssertHelperData *)local_330) {
    operator_delete((void *)local_340._0_8_);
  }
  local_340._0_8_ = (AssertHelperData *)local_330;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_340,"1234567890","");
  cfd::core::ByteData::ByteData
            ((ByteData *)
             ((long)&local_98.data_.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data + 8),(string *)local_340);
  if ((AssertHelperData *)local_340._0_8_ != (AssertHelperData *)local_330) {
    operator_delete((void *)local_340._0_8_);
  }
  local_340._0_8_ = (AssertHelperData *)local_330;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_340,"1234567890123456789012345678901234567890","");
  cfd::core::ByteData::ByteData(&local_70,(string *)local_340);
  if ((AssertHelperData *)local_340._0_8_ != (AssertHelperData *)local_330) {
    operator_delete((void *)local_340._0_8_);
  }
  bVar4 = testing::internal::AlwaysTrue();
  if (bVar4) {
    bVar4 = testing::internal::AlwaysTrue();
    if (bVar4) {
      local_368._16_4_ =
           cfd::core::ConfidentialTransaction::AddTxOut
                     ((Amount *)&local_d8,&local_98,(Script *)&local_58,
                      (ConfidentialNonce *)local_248,(ByteData *)local_210,
                      (ByteData *)
                      ((long)&local_98.data_.data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data + 8));
    }
  }
  else {
    testing::Message::Message((Message *)local_340);
    testing::internal::AssertHelper::AssertHelper
              (&local_398,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x28f,
               "Expected: (index = tx.AddTxOut(amt, asset, exp_locking_script2, nonce, surjection_proof, range_proof)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_398,(Message *)local_340);
    testing::internal::AssertHelper::~AssertHelper(&local_398);
    if ((AssertHelperData *)local_340._0_8_ != (AssertHelperData *)0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && ((AssertHelperData *)local_340._0_8_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(undefined **)local_340._0_8_ + 8))();
      }
    }
  }
  local_398.data_._0_4_ = 1;
  testing::internal::CmpHelperEQ<unsigned_int,int>
            ((internal *)local_340,"index","1",(uint *)(local_368 + 0x10),(int *)&local_398);
  if ((internal)local_340[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_398);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_340._8_8_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *(char **)local_340._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_378,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x290,pcVar7);
    testing::internal::AssertHelper::operator=(&local_378,(Message *)&local_398);
    testing::internal::AssertHelper::~AssertHelper(&local_378);
    if (local_398.data_ != (AssertHelperData *)0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && (local_398.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_398.data_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_340 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  uVar5 = cfd::core::ConfidentialTransaction::GetTxOutCount();
  local_398.data_._0_4_ = uVar5;
  local_378.data_._0_4_ = 2;
  testing::internal::CmpHelperEQ<unsigned_int,int>
            ((internal *)local_340,"tx.GetTxOutCount()","2",(uint *)&local_398,(int *)&local_378);
  if ((internal)local_340[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_398);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_340._8_8_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *(char **)local_340._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_378,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x291,pcVar7);
    testing::internal::AssertHelper::operator=(&local_378,(Message *)&local_398);
    testing::internal::AssertHelper::~AssertHelper(&local_378);
    if (local_398.data_ != (AssertHelperData *)0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && (local_398.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_398.data_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_340 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  bVar4 = testing::internal::AlwaysTrue();
  if (bVar4) {
    bVar4 = testing::internal::AlwaysTrue();
    if (bVar4) {
      cfd::core::ConfidentialTransaction::GetTxOut((uint)local_340);
      local_1c0 = local_330[0];
      local_1c8.ptr_ =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_340._8_8_;
      cfd::core::Script::operator=(&local_1b8,(Script *)(local_330 + 8));
      cfd::core::ConfidentialAssetId::operator=(&local_180,&local_2f0);
      cfd::core::ConfidentialValue::operator=(&local_158,&local_2c8);
      cfd::core::ConfidentialNonce::operator=(&local_130,&local_2a0);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=(&local_108,&local_278);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=(&local_f0,&local_260);
      cfd::core::ConfidentialTxOutReference::~ConfidentialTxOutReference
                ((ConfidentialTxOutReference *)local_340);
    }
  }
  else {
    testing::Message::Message((Message *)local_340);
    testing::internal::AssertHelper::AssertHelper
              (&local_398,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x292,
               "Expected: (txout_ref = tx.GetTxOut(index)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_398,(Message *)local_340);
    testing::internal::AssertHelper::~AssertHelper(&local_398);
    if ((AssertHelperData *)local_340._0_8_ != (AssertHelperData *)0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && ((AssertHelperData *)local_340._0_8_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(undefined **)local_340._0_8_ + 8))();
      }
    }
  }
  cfd::core::ConfidentialAssetId::ConfidentialAssetId((ConfidentialAssetId *)local_340,&local_180);
  cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_();
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_378,"txout_ref.GetAsset().GetHex().c_str()",
             "\"6f1a4b6bd5571b5f08ab79c314dc6483f9b952af2f5ef206cd6f8e68eb1186f3\"",
             (char *)local_398.data_,
             "6f1a4b6bd5571b5f08ab79c314dc6483f9b952af2f5ef206cd6f8e68eb1186f3");
  if (local_398.data_ != (AssertHelperData *)local_388) {
    operator_delete(local_398.data_);
  }
  local_340._0_8_ = &PTR__ConfidentialAssetId_004e1078;
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_340._8_8_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    operator_delete((void *)local_340._8_8_);
  }
  if (local_378.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_340);
    if (_Stack_370._M_p == (pointer)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *(char **)_Stack_370._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_398,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x295,pcVar7);
    testing::internal::AssertHelper::operator=(&local_398,(Message *)local_340);
    testing::internal::AssertHelper::~AssertHelper(&local_398);
    if ((AssertHelperData *)local_340._0_8_ != (AssertHelperData *)0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && ((AssertHelperData *)local_340._0_8_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(undefined **)local_340._0_8_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&_Stack_370,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::ConfidentialValue::ConfidentialValue((ConfidentialValue *)local_340,&local_158);
  cfd::core::ConfidentialValue::GetHex_abi_cxx11_();
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_378,"txout_ref.GetConfidentialValue().GetHex().c_str()",
             "\"010000000000bc614e\"",(char *)local_398.data_,"010000000000bc614e");
  if (local_398.data_ != (AssertHelperData *)local_388) {
    operator_delete(local_398.data_);
  }
  local_340._0_8_ = &PTR__ConfidentialValue_004e0f10;
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_340._8_8_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    operator_delete((void *)local_340._8_8_);
  }
  if (local_378.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_340);
    if (_Stack_370._M_p == (pointer)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *(char **)_Stack_370._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_398,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x297,pcVar7);
    testing::internal::AssertHelper::operator=(&local_398,(Message *)local_340);
    testing::internal::AssertHelper::~AssertHelper(&local_398);
    if ((AssertHelperData *)local_340._0_8_ != (AssertHelperData *)0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && ((AssertHelperData *)local_340._0_8_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(undefined **)local_340._0_8_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&_Stack_370,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::Script::Script((Script *)local_340,&local_1b8);
  cfd::core::Script::GetHex_abi_cxx11_();
  AVar1.data_ = local_398.data_;
  cfd::core::Script::GetHex_abi_cxx11_();
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_1e8,"txout_ref.GetLockingScript().GetHex().c_str()",
             "exp_locking_script2.GetHex().c_str()",(char *)AVar1.data_,(char *)local_378.data_);
  if (local_378.data_ != (AssertHelperData *)local_368) {
    operator_delete(local_378.data_);
  }
  if (local_398.data_ != (AssertHelperData *)local_388) {
    operator_delete(local_398.data_);
  }
  cfd::core::Script::~Script((Script *)local_340);
  if (local_1e8.
      super__Vector_base<cfd::core::ConfidentialTxOutReference,_std::allocator<cfd::core::ConfidentialTxOutReference>_>
      ._M_impl.super__Vector_impl_data._M_start._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_340);
    if (local_1e8.
        super__Vector_base<cfd::core::ConfidentialTxOutReference,_std::allocator<cfd::core::ConfidentialTxOutReference>_>
        ._M_impl.super__Vector_impl_data._M_finish == (pointer)0x0) {
      pp_Var10 = (_func_int **)0x43a303;
    }
    else {
      pp_Var10 = ((local_1e8.
                   super__Vector_base<cfd::core::ConfidentialTxOutReference,_std::allocator<cfd::core::ConfidentialTxOutReference>_>
                   ._M_impl.super__Vector_impl_data._M_finish)->super_AbstractTxOutReference).
                 _vptr_AbstractTxOutReference;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_398,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x299,(char *)pp_Var10);
    testing::internal::AssertHelper::operator=(&local_398,(Message *)local_340);
    testing::internal::AssertHelper::~AssertHelper(&local_398);
    if ((AssertHelperData *)local_340._0_8_ != (AssertHelperData *)0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && ((AssertHelperData *)local_340._0_8_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(undefined **)local_340._0_8_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)((long)&local_1e8.
                   super__Vector_base<cfd::core::ConfidentialTxOutReference,_std::allocator<cfd::core::ConfidentialTxOutReference>_>
                   ._M_impl + 8),
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::ConfidentialNonce::ConfidentialNonce((ConfidentialNonce *)local_340,&local_130);
  cfd::core::ConfidentialNonce::GetHex_abi_cxx11_();
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_378,"txout_ref.GetNonce().GetHex().c_str()",
             "\"01991a4b6bd5571b5f08ab79c314dc6483f9b952af2f5ef206cd6f8e68eb1186f3\"",
             (char *)local_398.data_,
             "01991a4b6bd5571b5f08ab79c314dc6483f9b952af2f5ef206cd6f8e68eb1186f3");
  if (local_398.data_ != (AssertHelperData *)local_388) {
    operator_delete(local_398.data_);
  }
  local_340._0_8_ = &PTR__ConfidentialNonce_004e1260;
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_340._8_8_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    operator_delete((void *)local_340._8_8_);
  }
  if (local_378.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_340);
    if (_Stack_370._M_p == (pointer)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *(char **)_Stack_370._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_398,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x29c,pcVar7);
    testing::internal::AssertHelper::operator=(&local_398,(Message *)local_340);
    testing::internal::AssertHelper::~AssertHelper(&local_398);
    if ((AssertHelperData *)local_340._0_8_ != (AssertHelperData *)0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && ((AssertHelperData *)local_340._0_8_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(undefined **)local_340._0_8_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&_Stack_370,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_378.data_ = (AssertHelperData *)0x0;
  _Stack_370._M_p = (pointer)0x0;
  local_368._0_8_ = 0;
  uVar8 = (long)local_108.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_108.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
  if (uVar8 == 0) {
    pAVar6 = (AssertHelperData *)0x0;
    sVar11 = 0;
  }
  else {
    if ((long)uVar8 < 0) {
      std::__throw_bad_alloc();
    }
    pAVar6 = (AssertHelperData *)operator_new(uVar8);
    sVar11 = (long)local_108.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)local_108.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start;
  }
  local_368._0_8_ = uVar8 + (long)pAVar6;
  local_378.data_ = pAVar6;
  if (local_108.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      local_108.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start) {
    _Stack_370._M_p = (pointer)pAVar6;
    memmove(pAVar6,local_108.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start,sVar11);
  }
  _Stack_370._M_p = (pointer)((long)&pAVar6->type + sVar11);
  cfd::core::ByteData::GetHex_abi_cxx11_();
  uVar2 = local_340._0_8_;
  cfd::core::ByteData::GetHex_abi_cxx11_();
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_1e8,"txout_ref.GetSurjectionProof().GetHex().c_str()",
             "surjection_proof.GetHex().c_str()",(char *)uVar2,(char *)local_398.data_);
  if (local_398.data_ != (AssertHelperData *)local_388) {
    operator_delete(local_398.data_);
  }
  if ((AssertHelperData *)local_340._0_8_ != (AssertHelperData *)local_330) {
    operator_delete((void *)local_340._0_8_);
  }
  if (local_378.data_ != (AssertHelperData *)0x0) {
    operator_delete(local_378.data_);
  }
  if (local_1e8.
      super__Vector_base<cfd::core::ConfidentialTxOutReference,_std::allocator<cfd::core::ConfidentialTxOutReference>_>
      ._M_impl.super__Vector_impl_data._M_start._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_340);
    if (local_1e8.
        super__Vector_base<cfd::core::ConfidentialTxOutReference,_std::allocator<cfd::core::ConfidentialTxOutReference>_>
        ._M_impl.super__Vector_impl_data._M_finish == (pointer)0x0) {
      pp_Var10 = (_func_int **)0x43a303;
    }
    else {
      pp_Var10 = ((local_1e8.
                   super__Vector_base<cfd::core::ConfidentialTxOutReference,_std::allocator<cfd::core::ConfidentialTxOutReference>_>
                   ._M_impl.super__Vector_impl_data._M_finish)->super_AbstractTxOutReference).
                 _vptr_AbstractTxOutReference;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_398,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x29e,(char *)pp_Var10);
    testing::internal::AssertHelper::operator=(&local_398,(Message *)local_340);
    testing::internal::AssertHelper::~AssertHelper(&local_398);
    if ((AssertHelperData *)local_340._0_8_ != (AssertHelperData *)0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && ((AssertHelperData *)local_340._0_8_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(undefined **)local_340._0_8_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)((long)&local_1e8.
                   super__Vector_base<cfd::core::ConfidentialTxOutReference,_std::allocator<cfd::core::ConfidentialTxOutReference>_>
                   ._M_impl + 8),
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_378.data_ = (AssertHelperData *)0x0;
  _Stack_370._M_p = (pointer)0x0;
  local_368._0_8_ = 0;
  uVar8 = (long)local_f0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_f0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
  if (uVar8 == 0) {
    pAVar6 = (AssertHelperData *)0x0;
    sVar11 = 0;
  }
  else {
    if ((long)uVar8 < 0) {
      std::__throw_bad_alloc();
    }
    pAVar6 = (AssertHelperData *)operator_new(uVar8);
    sVar11 = (long)local_f0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)local_f0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start;
  }
  local_368._0_8_ = uVar8 + (long)pAVar6;
  local_378.data_ = pAVar6;
  if (local_f0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      local_f0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start) {
    _Stack_370._M_p = (pointer)pAVar6;
    memmove(pAVar6,local_f0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start,sVar11);
  }
  _Stack_370._M_p = (pointer)((long)&pAVar6->type + sVar11);
  cfd::core::ByteData::GetHex_abi_cxx11_();
  uVar2 = local_340._0_8_;
  cfd::core::ByteData::GetHex_abi_cxx11_();
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_1e8,"txout_ref.GetRangeProof().GetHex().c_str()",
             "range_proof.GetHex().c_str()",(char *)uVar2,(char *)local_398.data_);
  if (local_398.data_ != (AssertHelperData *)local_388) {
    operator_delete(local_398.data_);
  }
  if ((AssertHelperData *)local_340._0_8_ != (AssertHelperData *)local_330) {
    operator_delete((void *)local_340._0_8_);
  }
  if (local_378.data_ != (AssertHelperData *)0x0) {
    operator_delete(local_378.data_);
  }
  if (local_1e8.
      super__Vector_base<cfd::core::ConfidentialTxOutReference,_std::allocator<cfd::core::ConfidentialTxOutReference>_>
      ._M_impl.super__Vector_impl_data._M_start._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_340);
    if (local_1e8.
        super__Vector_base<cfd::core::ConfidentialTxOutReference,_std::allocator<cfd::core::ConfidentialTxOutReference>_>
        ._M_impl.super__Vector_impl_data._M_finish == (pointer)0x0) {
      pp_Var10 = (_func_int **)0x43a303;
    }
    else {
      pp_Var10 = ((local_1e8.
                   super__Vector_base<cfd::core::ConfidentialTxOutReference,_std::allocator<cfd::core::ConfidentialTxOutReference>_>
                   ._M_impl.super__Vector_impl_data._M_finish)->super_AbstractTxOutReference).
                 _vptr_AbstractTxOutReference;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_398,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x2a0,(char *)pp_Var10);
    testing::internal::AssertHelper::operator=(&local_398,(Message *)local_340);
    testing::internal::AssertHelper::~AssertHelper(&local_398);
    if ((AssertHelperData *)local_340._0_8_ != (AssertHelperData *)0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && ((AssertHelperData *)local_340._0_8_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(undefined **)local_340._0_8_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)((long)&local_1e8.
                   super__Vector_base<cfd::core::ConfidentialTxOutReference,_std::allocator<cfd::core::ConfidentialTxOutReference>_>
                   ._M_impl + 8),
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  bVar4 = testing::internal::AlwaysTrue();
  if (bVar4) {
    bVar4 = testing::internal::AlwaysTrue();
    if (bVar4) {
      local_368._20_4_ = cfd::core::ConfidentialTransaction::GetTxOutIndex(&local_d8);
    }
  }
  else {
    testing::Message::Message((Message *)local_340);
    testing::internal::AssertHelper::AssertHelper
              (&local_398,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x2a1,
               "Expected: get_index = tx.GetTxOutIndex(exp_locking_script2) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_398,(Message *)local_340);
    testing::internal::AssertHelper::~AssertHelper(&local_398);
    if ((AssertHelperData *)local_340._0_8_ != (AssertHelperData *)0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && ((AssertHelperData *)local_340._0_8_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(undefined **)local_340._0_8_ + 8))();
      }
    }
  }
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            ((internal *)local_340,"index","get_index",(uint *)(local_368 + 0x10),
             (uint *)(local_368 + 0x14));
  if ((internal)local_340[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_398);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_340._8_8_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *(char **)local_340._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_378,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x2a2,pcVar7);
    testing::internal::AssertHelper::operator=(&local_378,(Message *)&local_398);
    testing::internal::AssertHelper::~AssertHelper(&local_378);
    if (local_398.data_ != (AssertHelperData *)0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && (local_398.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_398.data_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_340 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  local_1e8.
  super__Vector_base<cfd::core::ConfidentialTxOutReference,_std::allocator<cfd::core::ConfidentialTxOutReference>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1e8.
  super__Vector_base<cfd::core::ConfidentialTxOutReference,_std::allocator<cfd::core::ConfidentialTxOutReference>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1e8.
  super__Vector_base<cfd::core::ConfidentialTxOutReference,_std::allocator<cfd::core::ConfidentialTxOutReference>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bVar4 = testing::internal::AlwaysTrue();
  if (bVar4) {
    bVar4 = testing::internal::AlwaysTrue();
    if (bVar4) {
      cfd::core::ConfidentialTransaction::GetTxOutList();
      std::
      vector<cfd::core::ConfidentialTxOutReference,_std::allocator<cfd::core::ConfidentialTxOutReference>_>
      ::operator=(&local_1e8,
                  (vector<cfd::core::ConfidentialTxOutReference,_std::allocator<cfd::core::ConfidentialTxOutReference>_>
                   *)local_340);
      std::
      vector<cfd::core::ConfidentialTxOutReference,_std::allocator<cfd::core::ConfidentialTxOutReference>_>
      ::~vector((vector<cfd::core::ConfidentialTxOutReference,_std::allocator<cfd::core::ConfidentialTxOutReference>_>
                 *)local_340);
    }
  }
  else {
    testing::Message::Message((Message *)local_340);
    testing::internal::AssertHelper::AssertHelper
              (&local_398,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x2a6,
               "Expected: (txout_list = tx.GetTxOutList()) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_398,(Message *)local_340);
    testing::internal::AssertHelper::~AssertHelper(&local_398);
    if ((AssertHelperData *)local_340._0_8_ != (AssertHelperData *)0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && ((AssertHelperData *)local_340._0_8_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(undefined **)local_340._0_8_ + 8))();
      }
    }
  }
  local_398.data_ =
       (AssertHelperData *)
       (((long)local_1e8.
               super__Vector_base<cfd::core::ConfidentialTxOutReference,_std::allocator<cfd::core::ConfidentialTxOutReference>_>
               ._M_impl.super__Vector_impl_data._M_finish -
         (long)local_1e8.
               super__Vector_base<cfd::core::ConfidentialTxOutReference,_std::allocator<cfd::core::ConfidentialTxOutReference>_>
               ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x1084210842108421);
  local_378.data_._0_4_ = 2;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_340,"txout_list.size()","2",(unsigned_long *)&local_398,
             (int *)&local_378);
  if ((internal)local_340[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_398);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_340._8_8_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *(char **)local_340._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_378,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x2a7,pcVar7);
    testing::internal::AssertHelper::operator=(&local_378,(Message *)&local_398);
    testing::internal::AssertHelper::~AssertHelper(&local_378);
    if (local_398.data_ != (AssertHelperData *)0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && (local_398.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_398.data_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_340 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  pCVar3 = local_1e8.
           super__Vector_base<cfd::core::ConfidentialTxOutReference,_std::allocator<cfd::core::ConfidentialTxOutReference>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_1c8.ptr_ =
       *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
        &((local_1e8.
           super__Vector_base<cfd::core::ConfidentialTxOutReference,_std::allocator<cfd::core::ConfidentialTxOutReference>_>
           ._M_impl.super__Vector_impl_data._M_start)->super_AbstractTxOutReference).value_;
  local_1c0 = ((local_1e8.
                super__Vector_base<cfd::core::ConfidentialTxOutReference,_std::allocator<cfd::core::ConfidentialTxOutReference>_>
                ._M_impl.super__Vector_impl_data._M_start)->super_AbstractTxOutReference).field_0x10
  ;
  cfd::core::Script::operator=
            (&local_1b8,
             &((local_1e8.
                super__Vector_base<cfd::core::ConfidentialTxOutReference,_std::allocator<cfd::core::ConfidentialTxOutReference>_>
                ._M_impl.super__Vector_impl_data._M_start)->super_AbstractTxOutReference).
              locking_script_);
  cfd::core::ConfidentialAssetId::operator=(&local_180,&pCVar3->asset_);
  cfd::core::ConfidentialValue::operator=(&local_158,&pCVar3->confidential_value_);
  cfd::core::ConfidentialNonce::operator=(&local_130,&pCVar3->nonce_);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
            (&local_108,&(pCVar3->surjection_proof_).data_);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
            (&local_f0,&(pCVar3->range_proof_).data_);
  cfd::core::ConfidentialAssetId::ConfidentialAssetId((ConfidentialAssetId *)local_340,&local_180);
  cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_();
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_378,"txout_ref.GetAsset().GetHex().c_str()",
             "\"6f1a4b6bd5571b5f08ab79c314dc6483f9b952af2f5ef206cd6f8e68eb1186f3\"",
             (char *)local_398.data_,
             "6f1a4b6bd5571b5f08ab79c314dc6483f9b952af2f5ef206cd6f8e68eb1186f3");
  if (local_398.data_ != (AssertHelperData *)local_388) {
    operator_delete(local_398.data_);
  }
  local_340._0_8_ = &PTR__ConfidentialAssetId_004e1078;
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_340._8_8_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    operator_delete((void *)local_340._8_8_);
  }
  if (local_378.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_340);
    if (_Stack_370._M_p == (pointer)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *(char **)_Stack_370._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_398,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x2ab,pcVar7);
    testing::internal::AssertHelper::operator=(&local_398,(Message *)local_340);
    testing::internal::AssertHelper::~AssertHelper(&local_398);
    if ((AssertHelperData *)local_340._0_8_ != (AssertHelperData *)0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && ((AssertHelperData *)local_340._0_8_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(undefined **)local_340._0_8_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&_Stack_370,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::ConfidentialValue::ConfidentialValue((ConfidentialValue *)local_340,&local_158);
  cfd::core::ConfidentialValue::GetHex_abi_cxx11_();
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_378,"txout_ref.GetConfidentialValue().GetHex().c_str()",
             "\"010000000000bc614e\"",(char *)local_398.data_,"010000000000bc614e");
  if (local_398.data_ != (AssertHelperData *)local_388) {
    operator_delete(local_398.data_);
  }
  local_340._0_8_ = &PTR__ConfidentialValue_004e0f10;
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_340._8_8_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    operator_delete((void *)local_340._8_8_);
  }
  if (local_378.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_340);
    if (_Stack_370._M_p == (pointer)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *(char **)_Stack_370._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_398,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x2ad,pcVar7);
    testing::internal::AssertHelper::operator=(&local_398,(Message *)local_340);
    testing::internal::AssertHelper::~AssertHelper(&local_398);
    if ((AssertHelperData *)local_340._0_8_ != (AssertHelperData *)0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && ((AssertHelperData *)local_340._0_8_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(undefined **)local_340._0_8_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&_Stack_370,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::Script::Script((Script *)local_340,&local_1b8);
  cfd::core::Script::GetHex_abi_cxx11_();
  AVar1.data_ = local_398.data_;
  cfd::core::Script::GetHex_abi_cxx11_();
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_350,"txout_ref.GetLockingScript().GetHex().c_str()",
             "exp_locking_script.GetHex().c_str()",(char *)AVar1.data_,(char *)local_378.data_);
  if (local_378.data_ != (AssertHelperData *)local_368) {
    operator_delete(local_378.data_);
  }
  if (local_398.data_ != (AssertHelperData *)local_388) {
    operator_delete(local_398.data_);
  }
  cfd::core::Script::~Script((Script *)local_340);
  if (local_350.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_340);
    if (local_348.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar7 = "";
    }
    else {
      pcVar7 = ((local_348.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_398,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x2af,pcVar7);
    testing::internal::AssertHelper::operator=(&local_398,(Message *)local_340);
    testing::internal::AssertHelper::~AssertHelper(&local_398);
    if ((AssertHelperData *)local_340._0_8_ != (AssertHelperData *)0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && ((AssertHelperData *)local_340._0_8_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(undefined **)local_340._0_8_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_348,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::ConfidentialNonce::ConfidentialNonce((ConfidentialNonce *)local_340,&local_130);
  cfd::core::ConfidentialNonce::GetHex_abi_cxx11_();
  pcVar7 = "";
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_378,"txout_ref.GetNonce().GetHex().c_str()","\"\"",
             (char *)local_398.data_,"");
  if (local_398.data_ != (AssertHelperData *)local_388) {
    operator_delete(local_398.data_);
  }
  local_340._0_8_ = &PTR__ConfidentialNonce_004e1260;
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_340._8_8_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    operator_delete((void *)local_340._8_8_);
  }
  if (local_378.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_340);
    if (_Stack_370._M_p != (pointer)0x0) {
      pcVar7 = *(char **)_Stack_370._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_398,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x2b0,pcVar7);
    testing::internal::AssertHelper::operator=(&local_398,(Message *)local_340);
    testing::internal::AssertHelper::~AssertHelper(&local_398);
    if ((AssertHelperData *)local_340._0_8_ != (AssertHelperData *)0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && ((AssertHelperData *)local_340._0_8_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(undefined **)local_340._0_8_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&_Stack_370,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_398.data_ = (AssertHelperData *)0x0;
  sStack_390.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_388._0_8_ = 0;
  uVar8 = (long)local_108.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_108.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
  if (uVar8 == 0) {
    pAVar6 = (AssertHelperData *)0x0;
    sVar11 = 0;
  }
  else {
    if ((long)uVar8 < 0) {
      std::__throw_bad_alloc();
    }
    pAVar6 = (AssertHelperData *)operator_new(uVar8);
    sVar11 = (long)local_108.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)local_108.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start;
  }
  local_388._0_8_ = (long)pAVar6 + uVar8;
  local_398.data_ = pAVar6;
  if (local_108.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      local_108.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start) {
    sStack_390.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pAVar6;
    memmove(pAVar6,local_108.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start,sVar11);
  }
  sStack_390.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       ((long)&((_Alloc_hider *)&pAVar6->type)->_M_p + sVar11);
  cfd::core::ByteData::GetHex_abi_cxx11_();
  pcVar7 = "";
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_378,"txout_ref.GetSurjectionProof().GetHex().c_str()","\"\"",
             (char *)local_340._0_8_,"");
  if ((AssertHelperData *)local_340._0_8_ != (AssertHelperData *)local_330) {
    operator_delete((void *)local_340._0_8_);
  }
  if (local_398.data_ != (AssertHelperData *)0x0) {
    operator_delete(local_398.data_);
  }
  if (local_378.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_340);
    if (_Stack_370._M_p != (pointer)0x0) {
      pcVar7 = *(char **)_Stack_370._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_398,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x2b1,pcVar7);
    testing::internal::AssertHelper::operator=(&local_398,(Message *)local_340);
    testing::internal::AssertHelper::~AssertHelper(&local_398);
    if ((AssertHelperData *)local_340._0_8_ != (AssertHelperData *)0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && ((AssertHelperData *)local_340._0_8_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(undefined **)local_340._0_8_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&_Stack_370,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_398.data_ = (AssertHelperData *)0x0;
  sStack_390.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_388._0_8_ = 0;
  uVar8 = (long)local_f0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_f0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
  if (uVar8 == 0) {
    pAVar6 = (AssertHelperData *)0x0;
    sVar11 = 0;
  }
  else {
    if ((long)uVar8 < 0) {
      std::__throw_bad_alloc();
    }
    pAVar6 = (AssertHelperData *)operator_new(uVar8);
    sVar11 = (long)local_f0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)local_f0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start;
  }
  local_388._0_8_ = (long)pAVar6 + uVar8;
  local_398.data_ = pAVar6;
  if (local_f0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      local_f0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start) {
    sStack_390.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pAVar6;
    memmove(pAVar6,local_f0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start,sVar11);
  }
  sStack_390.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       ((long)&((_Alloc_hider *)&pAVar6->type)->_M_p + sVar11);
  cfd::core::ByteData::GetHex_abi_cxx11_();
  pcVar7 = "";
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_378,"txout_ref.GetRangeProof().GetHex().c_str()","\"\"",
             (char *)local_340._0_8_,"");
  if ((AssertHelperData *)local_340._0_8_ != (AssertHelperData *)local_330) {
    operator_delete((void *)local_340._0_8_);
  }
  if (local_398.data_ != (AssertHelperData *)0x0) {
    operator_delete(local_398.data_);
  }
  if (local_378.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_340);
    if (_Stack_370._M_p != (pointer)0x0) {
      pcVar7 = *(char **)_Stack_370._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_398,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x2b2,pcVar7);
    testing::internal::AssertHelper::operator=(&local_398,(Message *)local_340);
    testing::internal::AssertHelper::~AssertHelper(&local_398);
    if ((AssertHelperData *)local_340._0_8_ != (AssertHelperData *)0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && ((AssertHelperData *)local_340._0_8_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(undefined **)local_340._0_8_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&_Stack_370,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  pCVar3 = local_1e8.
           super__Vector_base<cfd::core::ConfidentialTxOutReference,_std::allocator<cfd::core::ConfidentialTxOutReference>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_1c0 = local_1e8.
              super__Vector_base<cfd::core::ConfidentialTxOutReference,_std::allocator<cfd::core::ConfidentialTxOutReference>_>
              ._M_impl.super__Vector_impl_data._M_start[1].super_AbstractTxOutReference.field_0x10;
  local_1c8.ptr_ =
       *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
        &local_1e8.
         super__Vector_base<cfd::core::ConfidentialTxOutReference,_std::allocator<cfd::core::ConfidentialTxOutReference>_>
         ._M_impl.super__Vector_impl_data._M_start[1].super_AbstractTxOutReference.value_;
  cfd::core::Script::operator=
            (&local_1b8,
             &local_1e8.
              super__Vector_base<cfd::core::ConfidentialTxOutReference,_std::allocator<cfd::core::ConfidentialTxOutReference>_>
              ._M_impl.super__Vector_impl_data._M_start[1].super_AbstractTxOutReference.
              locking_script_);
  cfd::core::ConfidentialAssetId::operator=(&local_180,&pCVar3[1].asset_);
  cfd::core::ConfidentialValue::operator=(&local_158,&pCVar3[1].confidential_value_);
  cfd::core::ConfidentialNonce::operator=(&local_130,&pCVar3[1].nonce_);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
            (&local_108,&pCVar3[1].surjection_proof_.data_);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
            (&local_f0,&pCVar3[1].range_proof_.data_);
  cfd::core::ConfidentialAssetId::ConfidentialAssetId((ConfidentialAssetId *)local_340,&local_180);
  cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_();
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_378,"txout_ref.GetAsset().GetHex().c_str()",
             "\"6f1a4b6bd5571b5f08ab79c314dc6483f9b952af2f5ef206cd6f8e68eb1186f3\"",
             (char *)local_398.data_,
             "6f1a4b6bd5571b5f08ab79c314dc6483f9b952af2f5ef206cd6f8e68eb1186f3");
  if (local_398.data_ != (AssertHelperData *)local_388) {
    operator_delete(local_398.data_);
  }
  local_340._0_8_ = &PTR__ConfidentialAssetId_004e1078;
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_340._8_8_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    operator_delete((void *)local_340._8_8_);
  }
  if (local_378.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_340);
    if (_Stack_370._M_p == (pointer)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *(char **)_Stack_370._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_398,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x2b7,pcVar7);
    testing::internal::AssertHelper::operator=(&local_398,(Message *)local_340);
    testing::internal::AssertHelper::~AssertHelper(&local_398);
    if ((AssertHelperData *)local_340._0_8_ != (AssertHelperData *)0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && ((AssertHelperData *)local_340._0_8_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(undefined **)local_340._0_8_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&_Stack_370,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::ConfidentialValue::ConfidentialValue((ConfidentialValue *)local_340,&local_158);
  cfd::core::ConfidentialValue::GetHex_abi_cxx11_();
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_378,"txout_ref.GetConfidentialValue().GetHex().c_str()",
             "\"010000000000bc614e\"",(char *)local_398.data_,"010000000000bc614e");
  if (local_398.data_ != (AssertHelperData *)local_388) {
    operator_delete(local_398.data_);
  }
  local_340._0_8_ = &PTR__ConfidentialValue_004e0f10;
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_340._8_8_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    operator_delete((void *)local_340._8_8_);
  }
  if (local_378.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_340);
    if (_Stack_370._M_p == (pointer)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *(char **)_Stack_370._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_398,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x2b9,pcVar7);
    testing::internal::AssertHelper::operator=(&local_398,(Message *)local_340);
    testing::internal::AssertHelper::~AssertHelper(&local_398);
    if ((AssertHelperData *)local_340._0_8_ != (AssertHelperData *)0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && ((AssertHelperData *)local_340._0_8_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(undefined **)local_340._0_8_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&_Stack_370,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::Script::Script((Script *)local_340,&local_1b8);
  cfd::core::Script::GetHex_abi_cxx11_();
  AVar1.data_ = local_398.data_;
  cfd::core::Script::GetHex_abi_cxx11_();
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_350,"txout_ref.GetLockingScript().GetHex().c_str()",
             "exp_locking_script2.GetHex().c_str()",(char *)AVar1.data_,(char *)local_378.data_);
  if (local_378.data_ != (AssertHelperData *)local_368) {
    operator_delete(local_378.data_);
  }
  if (local_398.data_ != (AssertHelperData *)local_388) {
    operator_delete(local_398.data_);
  }
  cfd::core::Script::~Script((Script *)local_340);
  if (local_350.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_340);
    if (local_348.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar7 = "";
    }
    else {
      pcVar7 = ((local_348.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_398,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,699,pcVar7);
    testing::internal::AssertHelper::operator=(&local_398,(Message *)local_340);
    testing::internal::AssertHelper::~AssertHelper(&local_398);
    if ((AssertHelperData *)local_340._0_8_ != (AssertHelperData *)0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && ((AssertHelperData *)local_340._0_8_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(undefined **)local_340._0_8_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_348,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::ConfidentialNonce::ConfidentialNonce((ConfidentialNonce *)local_340,&local_130);
  cfd::core::ConfidentialNonce::GetHex_abi_cxx11_();
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_378,"txout_ref.GetNonce().GetHex().c_str()",
             "\"01991a4b6bd5571b5f08ab79c314dc6483f9b952af2f5ef206cd6f8e68eb1186f3\"",
             (char *)local_398.data_,
             "01991a4b6bd5571b5f08ab79c314dc6483f9b952af2f5ef206cd6f8e68eb1186f3");
  if (local_398.data_ != (AssertHelperData *)local_388) {
    operator_delete(local_398.data_);
  }
  local_340._0_8_ = &PTR__ConfidentialNonce_004e1260;
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_340._8_8_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    operator_delete((void *)local_340._8_8_);
  }
  if (local_378.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_340);
    if (_Stack_370._M_p == (pointer)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *(char **)_Stack_370._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_398,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x2be,pcVar7);
    testing::internal::AssertHelper::operator=(&local_398,(Message *)local_340);
    testing::internal::AssertHelper::~AssertHelper(&local_398);
    if ((AssertHelperData *)local_340._0_8_ != (AssertHelperData *)0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && ((AssertHelperData *)local_340._0_8_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(undefined **)local_340._0_8_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&_Stack_370,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_378.data_ = (AssertHelperData *)0x0;
  _Stack_370._M_p = (pointer)0x0;
  local_368._0_8_ = 0;
  uVar8 = (long)local_108.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_108.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
  if (uVar8 == 0) {
    pAVar6 = (AssertHelperData *)0x0;
    sVar11 = 0;
  }
  else {
    if ((long)uVar8 < 0) {
      std::__throw_bad_alloc();
    }
    pAVar6 = (AssertHelperData *)operator_new(uVar8);
    sVar11 = (long)local_108.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)local_108.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start;
  }
  local_368._0_8_ = uVar8 + (long)pAVar6;
  local_378.data_ = pAVar6;
  if (local_108.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      local_108.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start) {
    _Stack_370._M_p = (pointer)pAVar6;
    memmove(pAVar6,local_108.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start,sVar11);
  }
  _Stack_370._M_p = (pointer)((long)&pAVar6->type + sVar11);
  cfd::core::ByteData::GetHex_abi_cxx11_();
  uVar2 = local_340._0_8_;
  cfd::core::ByteData::GetHex_abi_cxx11_();
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_350,"txout_ref.GetSurjectionProof().GetHex().c_str()",
             "surjection_proof.GetHex().c_str()",(char *)uVar2,(char *)local_398.data_);
  if (local_398.data_ != (AssertHelperData *)local_388) {
    operator_delete(local_398.data_);
  }
  if ((AssertHelperData *)local_340._0_8_ != (AssertHelperData *)local_330) {
    operator_delete((void *)local_340._0_8_);
  }
  if (local_378.data_ != (AssertHelperData *)0x0) {
    operator_delete(local_378.data_);
  }
  if (local_350.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_340);
    if (local_348.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar7 = "";
    }
    else {
      pcVar7 = ((local_348.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_398,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x2c0,pcVar7);
    testing::internal::AssertHelper::operator=(&local_398,(Message *)local_340);
    testing::internal::AssertHelper::~AssertHelper(&local_398);
    if ((AssertHelperData *)local_340._0_8_ != (AssertHelperData *)0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && ((AssertHelperData *)local_340._0_8_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(undefined **)local_340._0_8_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_348,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_378.data_ = (AssertHelperData *)0x0;
  _Stack_370._M_p = (pointer)0x0;
  local_368._0_8_ = 0;
  uVar8 = (long)local_f0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_f0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
  if (uVar8 == 0) {
    pAVar6 = (AssertHelperData *)0x0;
    sVar11 = 0;
  }
  else {
    if ((long)uVar8 < 0) {
      std::__throw_bad_alloc();
    }
    pAVar6 = (AssertHelperData *)operator_new(uVar8);
    sVar11 = (long)local_f0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)local_f0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start;
  }
  local_368._0_8_ = uVar8 + (long)pAVar6;
  local_378.data_ = pAVar6;
  if (local_f0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      local_f0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start) {
    _Stack_370._M_p = (pointer)pAVar6;
    memmove(pAVar6,local_f0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start,sVar11);
  }
  _Stack_370._M_p = (pointer)((long)&pAVar6->type + sVar11);
  cfd::core::ByteData::GetHex_abi_cxx11_();
  uVar2 = local_340._0_8_;
  cfd::core::ByteData::GetHex_abi_cxx11_();
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_350,"txout_ref.GetRangeProof().GetHex().c_str()",
             "range_proof.GetHex().c_str()",(char *)uVar2,(char *)local_398.data_);
  if (local_398.data_ != (AssertHelperData *)local_388) {
    operator_delete(local_398.data_);
  }
  if ((AssertHelperData *)local_340._0_8_ != (AssertHelperData *)local_330) {
    operator_delete((void *)local_340._0_8_);
  }
  if (local_378.data_ != (AssertHelperData *)0x0) {
    operator_delete(local_378.data_);
  }
  if (local_350.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_340);
    if (local_348.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar7 = "";
    }
    else {
      pcVar7 = ((local_348.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_398,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x2c2,pcVar7);
    testing::internal::AssertHelper::operator=(&local_398,(Message *)local_340);
    testing::internal::AssertHelper::~AssertHelper(&local_398);
    if ((AssertHelperData *)local_340._0_8_ != (AssertHelperData *)0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && ((AssertHelperData *)local_340._0_8_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(undefined **)local_340._0_8_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_348,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  bVar4 = testing::internal::AlwaysTrue();
  if (bVar4) {
    bVar4 = testing::internal::AlwaysTrue();
    if (bVar4) {
      local_368._16_4_ =
           cfd::core::ConfidentialTransaction::AddTxOut
                     ((Amount *)&local_d8,&local_98,(Script *)&local_58);
    }
  }
  else {
    testing::Message::Message((Message *)local_340);
    testing::internal::AssertHelper::AssertHelper
              (&local_398,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x2c5,
               "Expected: (index = tx.AddTxOut(amt, asset, exp_locking_script)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_398,(Message *)local_340);
    testing::internal::AssertHelper::~AssertHelper(&local_398);
    if ((AssertHelperData *)local_340._0_8_ != (AssertHelperData *)0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && ((AssertHelperData *)local_340._0_8_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(undefined **)local_340._0_8_ + 8))();
      }
    }
  }
  local_398.data_._0_4_ = 2;
  testing::internal::CmpHelperEQ<unsigned_int,int>
            ((internal *)local_340,"index","2",(uint *)(local_368 + 0x10),(int *)&local_398);
  if ((internal)local_340[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_398);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_340._8_8_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *(char **)local_340._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_378,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x2c6,pcVar7);
    testing::internal::AssertHelper::operator=(&local_378,(Message *)&local_398);
    testing::internal::AssertHelper::~AssertHelper(&local_378);
    if (local_398.data_ != (AssertHelperData *)0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && (local_398.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_398.data_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_340 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  uVar5 = cfd::core::ConfidentialTransaction::GetTxOutCount();
  local_398.data_._0_4_ = uVar5;
  local_378.data_._0_4_ = 3;
  testing::internal::CmpHelperEQ<unsigned_int,int>
            ((internal *)local_340,"tx.GetTxOutCount()","3",(uint *)&local_398,(int *)&local_378);
  if ((internal)local_340[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_398);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_340._8_8_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *(char **)local_340._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_378,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x2c7,pcVar7);
    testing::internal::AssertHelper::operator=(&local_378,(Message *)&local_398);
    testing::internal::AssertHelper::~AssertHelper(&local_378);
    if (local_398.data_ != (AssertHelperData *)0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && (local_398.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_398.data_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_340 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  bVar4 = testing::internal::AlwaysTrue();
  if (bVar4) {
    bVar4 = testing::internal::AlwaysTrue();
    if (bVar4) {
      local_368._20_4_ = cfd::core::ConfidentialTransaction::GetTxOutIndex(&local_d8);
    }
  }
  else {
    testing::Message::Message((Message *)local_340);
    testing::internal::AssertHelper::AssertHelper
              (&local_398,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x2c8,
               "Expected: get_index = tx.GetTxOutIndex(exp_locking_script) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_398,(Message *)local_340);
    testing::internal::AssertHelper::~AssertHelper(&local_398);
    if ((AssertHelperData *)local_340._0_8_ != (AssertHelperData *)0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && ((AssertHelperData *)local_340._0_8_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(undefined **)local_340._0_8_ + 8))();
      }
    }
  }
  local_398.data_ = local_398.data_ & 0xffffffff00000000;
  testing::internal::CmpHelperEQ<int,unsigned_int>
            ((internal *)local_340,"0","get_index",(int *)&local_398,(uint *)(local_368 + 0x14));
  if ((internal)local_340[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_398);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_340._8_8_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *(char **)local_340._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_378,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x2c9,pcVar7);
    testing::internal::AssertHelper::operator=(&local_378,(Message *)&local_398);
    testing::internal::AssertHelper::~AssertHelper(&local_378);
    if (local_398.data_ != (AssertHelperData *)0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && (local_398.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_398.data_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_340 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  bVar4 = testing::internal::AlwaysTrue();
  if (bVar4) {
    bVar4 = testing::internal::AlwaysTrue();
    pbVar9 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    pAVar6 = (AssertHelperData *)0x0;
    if (bVar4) {
      cfd::core::ConfidentialTransaction::GetTxOutIndexList((Script *)local_340);
      pbVar9 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_340._8_8_;
      pAVar6 = (AssertHelperData *)local_340._0_8_;
    }
  }
  else {
    testing::Message::Message((Message *)local_340);
    testing::internal::AssertHelper::AssertHelper
              (&local_398,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x2cb,
               "Expected: index_list = tx.GetTxOutIndexList(exp_locking_script) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_398,(Message *)local_340);
    testing::internal::AssertHelper::~AssertHelper(&local_398);
    if ((AssertHelperData *)local_340._0_8_ != (AssertHelperData *)0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && ((AssertHelperData *)local_340._0_8_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(undefined **)local_340._0_8_ + 8))();
      }
    }
    pAVar6 = (AssertHelperData *)0x0;
    pbVar9 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  }
  local_378.data_._0_4_ = 2;
  local_398.data_ = (AssertHelperData *)((long)pbVar9 - (long)pAVar6 >> 2);
  testing::internal::CmpHelperEQ<int,unsigned_long>
            ((internal *)local_340,"2","index_list.size()",(int *)&local_378,
             (unsigned_long *)&local_398);
  if ((internal)local_340[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_398);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_340._8_8_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *(char **)local_340._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_378,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x2cc,pcVar7);
    testing::internal::AssertHelper::operator=(&local_378,(Message *)&local_398);
    testing::internal::AssertHelper::~AssertHelper(&local_378);
    if (local_398.data_ != (AssertHelperData *)0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && (local_398.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_398.data_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_340 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  if ((long)pbVar9 - (long)pAVar6 == 8) {
    local_398.data_ = local_398.data_ & 0xffffffff00000000;
    testing::internal::CmpHelperEQ<int,unsigned_int>
              ((internal *)local_340,"0","index_list[0]",(int *)&local_398,&pAVar6->type);
    if ((internal)local_340[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_398);
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_340._8_8_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar7 = "";
      }
      else {
        pcVar7 = *(char **)local_340._8_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_378,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
                 ,0x2ce,pcVar7);
      testing::internal::AssertHelper::operator=(&local_378,(Message *)&local_398);
      testing::internal::AssertHelper::~AssertHelper(&local_378);
      if (local_398.data_ != (AssertHelperData *)0x0) {
        bVar4 = testing::internal::IsTrue(true);
        if ((bVar4) && (local_398.data_ != (AssertHelperData *)0x0)) {
          (**(code **)(*(long *)local_398.data_ + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)(local_340 + 8),
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    local_398.data_._0_4_ = 2;
    testing::internal::CmpHelperEQ<int,unsigned_int>
              ((internal *)local_340,"2","index_list[1]",(int *)&local_398,
               (uint *)&pAVar6->field_0x4);
    if ((internal)local_340[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_398);
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_340._8_8_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar7 = "";
      }
      else {
        pcVar7 = *(char **)local_340._8_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_378,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
                 ,0x2cf,pcVar7);
      testing::internal::AssertHelper::operator=(&local_378,(Message *)&local_398);
      testing::internal::AssertHelper::~AssertHelper(&local_378);
      if (local_398.data_ != (AssertHelperData *)0x0) {
        bVar4 = testing::internal::IsTrue(true);
        if ((bVar4) && (local_398.data_ != (AssertHelperData *)0x0)) {
          (**(code **)(*(long *)local_398.data_ + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)(local_340 + 8),
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  }
  local_378.data_ = (AssertHelperData *)cfd::core::Amount::CreateBySatoshiAmount(0x74cbb1);
  _Stack_370._M_p._0_1_ = extraout_DL_00;
  bVar4 = testing::internal::AlwaysTrue();
  if (bVar4) {
    bVar4 = testing::internal::AlwaysTrue();
    if (bVar4) {
      cfd::core::ConfidentialTransaction::SetTxOutValue((uint)&local_d8,(Amount *)0x2);
    }
  }
  else {
    testing::Message::Message((Message *)local_340);
    testing::internal::AssertHelper::AssertHelper
              (&local_398,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x2d4,
               "Expected: tx.SetTxOutValue(2, amt2) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_398,(Message *)local_340);
    testing::internal::AssertHelper::~AssertHelper(&local_398);
    if ((AssertHelperData *)local_340._0_8_ != (AssertHelperData *)0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && ((AssertHelperData *)local_340._0_8_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(undefined **)local_340._0_8_ + 8))();
      }
    }
  }
  bVar4 = testing::internal::AlwaysTrue();
  if (bVar4) {
    bVar4 = testing::internal::AlwaysTrue();
    if (bVar4) {
      cfd::core::ConfidentialTransaction::GetTxOut((uint)local_340);
      local_1c0 = local_330[0];
      local_1c8.ptr_ =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_340._8_8_;
      cfd::core::Script::operator=(&local_1b8,(Script *)(local_330 + 8));
      cfd::core::ConfidentialAssetId::operator=(&local_180,&local_2f0);
      cfd::core::ConfidentialValue::operator=(&local_158,&local_2c8);
      cfd::core::ConfidentialNonce::operator=(&local_130,&local_2a0);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=(&local_108,&local_278);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=(&local_f0,&local_260);
      cfd::core::ConfidentialTxOutReference::~ConfidentialTxOutReference
                ((ConfidentialTxOutReference *)local_340);
    }
  }
  else {
    testing::Message::Message((Message *)local_340);
    testing::internal::AssertHelper::AssertHelper
              (&local_398,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x2d5,
               "Expected: (txout_ref = tx.GetTxOut(2)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_398,(Message *)local_340);
    testing::internal::AssertHelper::~AssertHelper(&local_398);
    if ((AssertHelperData *)local_340._0_8_ != (AssertHelperData *)0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && ((AssertHelperData *)local_340._0_8_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(undefined **)local_340._0_8_ + 8))();
      }
    }
  }
  cfd::core::ConfidentialValue::ConfidentialValue((ConfidentialValue *)local_340,&local_158);
  cfd::core::ConfidentialValue::GetHex_abi_cxx11_();
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_350,"txout_ref.GetConfidentialValue().GetHex().c_str()",
             "\"01000000000074cbb1\"",(char *)local_398.data_,"01000000000074cbb1");
  if (local_398.data_ != (AssertHelperData *)local_388) {
    operator_delete(local_398.data_);
  }
  local_340._0_8_ = &PTR__ConfidentialValue_004e0f10;
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_340._8_8_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    operator_delete((void *)local_340._8_8_);
  }
  if (local_350.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_340);
    if (local_348.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar7 = "";
    }
    else {
      pcVar7 = ((local_348.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_398,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x2d7,pcVar7);
    testing::internal::AssertHelper::operator=(&local_398,(Message *)local_340);
    testing::internal::AssertHelper::~AssertHelper(&local_398);
    if ((AssertHelperData *)local_340._0_8_ != (AssertHelperData *)0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && ((AssertHelperData *)local_340._0_8_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(undefined **)local_340._0_8_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_348,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  bVar4 = testing::internal::AlwaysTrue();
  if (bVar4) {
    cfd::core::ConfidentialTransaction::RemoveTxOut((uint)&local_d8);
  }
  testing::Message::Message((Message *)local_340);
  testing::internal::AssertHelper::AssertHelper
            (&local_398,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
             ,0x2da,
             "Expected: (tx.RemoveTxOut(3)) throws an exception of type CfdException.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=(&local_398,(Message *)local_340);
  testing::internal::AssertHelper::~AssertHelper(&local_398);
  if ((AssertHelperData *)local_340._0_8_ != (AssertHelperData *)0x0) {
    bVar4 = testing::internal::IsTrue(true);
    if ((bVar4) && ((AssertHelperData *)local_340._0_8_ != (AssertHelperData *)0x0)) {
      (**(code **)(*(undefined **)local_340._0_8_ + 8))();
    }
  }
  bVar4 = testing::internal::AlwaysTrue();
  if (bVar4) {
    bVar4 = testing::internal::AlwaysTrue();
    if (bVar4) {
      cfd::core::ConfidentialTransaction::RemoveTxOut((uint)&local_d8);
    }
  }
  else {
    testing::Message::Message((Message *)local_340);
    testing::internal::AssertHelper::AssertHelper
              (&local_398,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x2db,
               "Expected: (tx.RemoveTxOut(0)) doesn\'t throw an exception.\n  Actual: it throws.");
    testing::internal::AssertHelper::operator=(&local_398,(Message *)local_340);
    testing::internal::AssertHelper::~AssertHelper(&local_398);
    if ((AssertHelperData *)local_340._0_8_ != (AssertHelperData *)0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && ((AssertHelperData *)local_340._0_8_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(undefined **)local_340._0_8_ + 8))();
      }
    }
  }
  uVar5 = cfd::core::ConfidentialTransaction::GetTxOutCount();
  local_398.data_._0_4_ = uVar5;
  local_350.data_._0_4_ = 2;
  testing::internal::CmpHelperEQ<unsigned_int,int>
            ((internal *)local_340,"tx.GetTxOutCount()","2",(uint *)&local_398,(int *)&local_350);
  if ((internal)local_340[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_398);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_340._8_8_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *(char **)local_340._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_350,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x2dc,pcVar7);
    testing::internal::AssertHelper::operator=(&local_350,(Message *)&local_398);
    testing::internal::AssertHelper::~AssertHelper(&local_350);
    if (local_398.data_ != (AssertHelperData *)0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && (local_398.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_398.data_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_340 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  if (pAVar6 != (AssertHelperData *)0x0) {
    operator_delete(pAVar6);
  }
  std::
  vector<cfd::core::ConfidentialTxOutReference,_std::allocator<cfd::core::ConfidentialTxOutReference>_>
  ::~vector(&local_1e8);
  if (local_70.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_70.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_98.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
      .super__Vector_impl_data._M_finish != (pointer)0x0) {
    operator_delete(local_98.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_finish);
  }
  local_210._0_8_ = &PTR__ConfidentialNonce_004e1260;
  if ((pointer)local_210._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_210._8_8_);
  }
  cfd::core::Script::~Script((Script *)local_248);
  cfd::core::ConfidentialTxOutReference::~ConfidentialTxOutReference
            ((ConfidentialTxOutReference *)local_1d0);
  local_58._vptr_ConfidentialAssetId = (_func_int **)&PTR__ConfidentialAssetId_004e1078;
  if (local_58.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
      .super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_58.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  cfd::core::ConfidentialTransaction::~ConfidentialTransaction((ConfidentialTransaction *)&local_d8)
  ;
  return;
}

Assistant:

TEST(ConfidentialTransaction, TxOutTest) {
  ConfidentialTransaction tx(exp_tx_empty_hex);
  uint32_t index = 0;
  uint32_t get_index = 0;
  EXPECT_NO_THROW((index = tx.AddTxIn(exp_txid, exp_index, exp_sequence)));

  // AddTxOut, GetTxOut, GetTxOutCount
  EXPECT_EQ(tx.GetTxOutCount(), 0);
  int64_t exp_satoshi = 12345678;
  EXPECT_THROW((get_index = tx.GetTxOutIndex(exp_locking_script)), CfdException);

  Amount amt = Amount::CreateBySatoshiAmount(exp_satoshi);
  ConfidentialAssetId asset(exp_assetid);
  ConfidentialTxOutReference txout_ref;
  EXPECT_NO_THROW((index = tx.AddTxOut(amt, asset, exp_locking_script)));
  EXPECT_EQ(index, 0);
  EXPECT_EQ(tx.GetTxOutCount(), 1);
  EXPECT_NO_THROW(get_index = tx.GetTxOutIndex(exp_locking_script));
  EXPECT_EQ(index, get_index);

  EXPECT_THROW((txout_ref = tx.GetTxOut(index + 5)), CfdException);
  EXPECT_NO_THROW((txout_ref = tx.GetTxOut(index)));
  EXPECT_STREQ(
      txout_ref.GetAsset().GetHex().c_str(),
      "6f1a4b6bd5571b5f08ab79c314dc6483f9b952af2f5ef206cd6f8e68eb1186f3");
  EXPECT_STREQ(txout_ref.GetConfidentialValue().GetHex().c_str(),
               "010000000000bc614e");
  EXPECT_STREQ(txout_ref.GetLockingScript().GetHex().c_str(),
               exp_locking_script.GetHex().c_str());
  EXPECT_STREQ(txout_ref.GetNonce().GetHex().c_str(), "");
  EXPECT_STREQ(txout_ref.GetSurjectionProof().GetHex().c_str(), "");
  EXPECT_STREQ(txout_ref.GetRangeProof().GetHex().c_str(), "");

  // AddTxOut
  Script exp_locking_script2("00146a98a3f2935718df72518c00768ec67c589e0b28");
  ConfidentialNonce nonce(
      "991a4b6bd5571b5f08ab79c314dc6483f9b952af2f5ef206cd6f8e68eb1186f3");
  ByteData surjection_proof("1234567890");
  ByteData range_proof("1234567890123456789012345678901234567890");
  EXPECT_NO_THROW(
      (index = tx.AddTxOut(amt, asset, exp_locking_script2, nonce,
                           surjection_proof, range_proof)));
  EXPECT_EQ(index, 1);
  EXPECT_EQ(tx.GetTxOutCount(), 2);
  EXPECT_NO_THROW((txout_ref = tx.GetTxOut(index)));
  EXPECT_STREQ(
      txout_ref.GetAsset().GetHex().c_str(),
      "6f1a4b6bd5571b5f08ab79c314dc6483f9b952af2f5ef206cd6f8e68eb1186f3");
  EXPECT_STREQ(txout_ref.GetConfidentialValue().GetHex().c_str(),
               "010000000000bc614e");
  EXPECT_STREQ(txout_ref.GetLockingScript().GetHex().c_str(),
               exp_locking_script2.GetHex().c_str());
  EXPECT_STREQ(
      txout_ref.GetNonce().GetHex().c_str(),
      "01991a4b6bd5571b5f08ab79c314dc6483f9b952af2f5ef206cd6f8e68eb1186f3");
  EXPECT_STREQ(txout_ref.GetSurjectionProof().GetHex().c_str(),
               surjection_proof.GetHex().c_str());
  EXPECT_STREQ(txout_ref.GetRangeProof().GetHex().c_str(),
               range_proof.GetHex().c_str());
  EXPECT_NO_THROW(get_index = tx.GetTxOutIndex(exp_locking_script2));
  EXPECT_EQ(index, get_index);

  // GetTxOutList
  std::vector<ConfidentialTxOutReference> txout_list;
  EXPECT_NO_THROW((txout_list = tx.GetTxOutList()));
  EXPECT_EQ(txout_list.size(), 2);
  txout_ref = txout_list[0];
  EXPECT_STREQ(
      txout_ref.GetAsset().GetHex().c_str(),
      "6f1a4b6bd5571b5f08ab79c314dc6483f9b952af2f5ef206cd6f8e68eb1186f3");
  EXPECT_STREQ(txout_ref.GetConfidentialValue().GetHex().c_str(),
               "010000000000bc614e");
  EXPECT_STREQ(txout_ref.GetLockingScript().GetHex().c_str(),
               exp_locking_script.GetHex().c_str());
  EXPECT_STREQ(txout_ref.GetNonce().GetHex().c_str(), "");
  EXPECT_STREQ(txout_ref.GetSurjectionProof().GetHex().c_str(), "");
  EXPECT_STREQ(txout_ref.GetRangeProof().GetHex().c_str(), "");

  txout_ref = txout_list[1];
  EXPECT_STREQ(
      txout_ref.GetAsset().GetHex().c_str(),
      "6f1a4b6bd5571b5f08ab79c314dc6483f9b952af2f5ef206cd6f8e68eb1186f3");
  EXPECT_STREQ(txout_ref.GetConfidentialValue().GetHex().c_str(),
               "010000000000bc614e");
  EXPECT_STREQ(txout_ref.GetLockingScript().GetHex().c_str(),
               exp_locking_script2.GetHex().c_str());
  EXPECT_STREQ(
      txout_ref.GetNonce().GetHex().c_str(),
      "01991a4b6bd5571b5f08ab79c314dc6483f9b952af2f5ef206cd6f8e68eb1186f3");
  EXPECT_STREQ(txout_ref.GetSurjectionProof().GetHex().c_str(),
               surjection_proof.GetHex().c_str());
  EXPECT_STREQ(txout_ref.GetRangeProof().GetHex().c_str(),
               range_proof.GetHex().c_str());

  // AddTxOut (address duplex)
  EXPECT_NO_THROW((index = tx.AddTxOut(amt, asset, exp_locking_script)));
  EXPECT_EQ(index, 2);
  EXPECT_EQ(tx.GetTxOutCount(), 3);
  EXPECT_NO_THROW(get_index = tx.GetTxOutIndex(exp_locking_script));
  EXPECT_EQ(0, get_index);
  std::vector<uint32_t> index_list;
  EXPECT_NO_THROW(index_list = tx.GetTxOutIndexList(exp_locking_script));
  EXPECT_EQ(2, index_list.size());
  if (index_list.size() == 2) {
    EXPECT_EQ(0, index_list[0]);
    EXPECT_EQ(2, index_list[1]);
  }

  // SetTxOutValue (address duplex)
  Amount amt2 = Amount::CreateBySatoshiAmount(7654321);
  EXPECT_NO_THROW(tx.SetTxOutValue(2, amt2));
  EXPECT_NO_THROW((txout_ref = tx.GetTxOut(2)));
  EXPECT_STREQ(txout_ref.GetConfidentialValue().GetHex().c_str(),
               "01000000000074cbb1");

  // RemoveTxOut
  EXPECT_THROW((tx.RemoveTxOut(3)), CfdException);
  EXPECT_NO_THROW((tx.RemoveTxOut(0)));
  EXPECT_EQ(tx.GetTxOutCount(), 2);
}